

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O0

UChar * ufmt_getUChars_63(UFormattable *fmt,int32_t *len,UErrorCode *status)

{
  UBool UVar1;
  Type TVar2;
  int32_t iVar3;
  Formattable *this;
  UnicodeString *this_00;
  UnicodeString *str;
  Formattable *obj;
  UErrorCode *status_local;
  int32_t *len_local;
  UFormattable *fmt_local;
  
  this = icu_63::Formattable::fromUFormattable(fmt);
  TVar2 = icu_63::Formattable::getType(this);
  if (TVar2 == kString) {
    this_00 = icu_63::Formattable::getString(this,status);
    UVar1 = U_SUCCESS(*status);
    if ((UVar1 != '\0') && (len != (int32_t *)0x0)) {
      iVar3 = icu_63::UnicodeString::length(this_00);
      *len = iVar3;
    }
    fmt_local = (UFormattable *)icu_63::UnicodeString::getTerminatedBuffer(this_00);
  }
  else {
    UVar1 = U_SUCCESS(*status);
    if (UVar1 != '\0') {
      *status = U_INVALID_FORMAT_ERROR;
    }
    fmt_local = (UFormattable *)0x0;
  }
  return (UChar *)fmt_local;
}

Assistant:

U_DRAFT const UChar* U_EXPORT2
ufmt_getUChars(UFormattable *fmt, int32_t *len, UErrorCode *status) {
  Formattable *obj = Formattable::fromUFormattable(fmt);

  // avoid bogosity by checking the type first.
  if( obj->getType() != Formattable::kString ) {
    if( U_SUCCESS(*status) ){
      *status = U_INVALID_FORMAT_ERROR;
    }
    return NULL;
  }

  // This should return a valid string
  UnicodeString &str = obj->getString(*status);
  if( U_SUCCESS(*status) && len != NULL ) {
    *len = str.length();
  }
  return str.getTerminatedBuffer();
}